

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O3

void * mpp_enc_async_thread(void *data)

{
  int *piVar1;
  RK_S32 *pRVar2;
  RK_U32 *pRVar3;
  byte *pbVar4;
  MppEncImpl *enc;
  MppEncRefFrmUsrCfg *pMVar5;
  pthread_mutex_t *ppVar6;
  bool bVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  RK_S32 RVar10;
  MppEncRefMode MVar11;
  RK_S32 RVar12;
  MppThreadStatus MVar13;
  MPP_RET MVar14;
  RK_S32 RVar15;
  RK_U32 RVar16;
  EncAsyncTaskInfo *pEVar17;
  EncAsyncTaskInfo *__s;
  pthread_mutex_t *ppVar18;
  MppBuffer pvVar19;
  void *pvVar20;
  size_t sVar21;
  MppStopwatch pvVar22;
  MppMeta pvVar23;
  RK_S64 RVar24;
  uint uVar25;
  char *pcVar26;
  EncRcTask *pEVar27;
  char *fmt;
  MppEncHal pvVar28;
  HalEncTask *pHVar29;
  uint uVar30;
  MppPacket pvVar31;
  Mpp *pMVar32;
  undefined8 uVar33;
  MppPskipMode MVar34;
  Mpp *mpp;
  MppThread *this;
  mpp_list *frm_in;
  MppFrame s;
  ulong uVar35;
  Mpp *pMVar36;
  ushort uVar37;
  EncAsyncWait EVar38;
  mpp_list *pkt_out;
  EncFrmStatus *pEVar39;
  bool bVar40;
  MppFrame frm;
  mpp_list *pkt_out_1;
  EncAsyncWait wait;
  MppPacket packet;
  void *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  MppPskipMode local_d0;
  pthread_mutex_t *local_c8;
  EncAsyncWait local_bc;
  MppPacket local_b8;
  Mpp *local_b0;
  EncRcTask *local_a8;
  MppThread *local_a0;
  MppFrame local_98;
  void *local_90;
  HalEncTask *local_88;
  MppEncHal local_80;
  pthread_mutex_t *local_78;
  HalTaskHnd *local_70;
  pthread_mutex_t *local_68;
  MppEncRefFrmUsrCfg *local_60;
  sem_t *local_58;
  sem_t *local_50;
  sem_t *local_48;
  pthread_cond_t *local_40;
  void *local_38;
  
  enc = *(MppEncImpl **)((long)data + 0xb0);
  this = enc->thread_enc;
  local_38 = data;
  if (((byte)mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","thread start\n","mpp_enc_async_thread");
  }
  local_bc.val = 0;
  local_78 = (pthread_mutex_t *)this->mMutexCond;
  pthread_mutex_lock(local_78);
  MVar13 = MppThread::get_status(this,THREAD_WORK);
  if (MVar13 == MPP_THREAD_RUNNING) {
    local_40 = (pthread_cond_t *)&this->mMutexCond[0].mCondition;
    local_48 = (sem_t *)&enc->cmd_start;
    local_50 = (sem_t *)&enc->cmd_done;
    local_60 = &enc->frm_cfg;
    local_68 = (pthread_mutex_t *)(this->mMutexCond + 3);
    local_58 = (sem_t *)&enc->enc_reset;
    local_70 = &enc->hnd;
    local_a0 = this;
    do {
      EVar38 = local_bc;
      uVar30 = enc->notify_flag;
      RVar16 = 0;
      bVar7 = true;
      if (enc->reset_flag == 0) {
        if ((uVar30 & 0x10) != 0) {
          RVar16 = uVar30 & 0xffffffef;
          goto LAB_00141270;
        }
        bVar40 = (local_bc.val & uVar30) != 0;
        bVar7 = bVar40 || local_bc.val == 0;
        pcVar26 = "wait";
        if (bVar40 || local_bc.val == 0) {
          pcVar26 = "work";
        }
      }
      else {
LAB_00141270:
        pcVar26 = "work";
      }
      if (((byte)mpp_enc_debug & 0x10) != 0) {
        in_stack_ffffffffffffff10 =
             CONCAT44((int)(in_stack_ffffffffffffff10 >> 0x20),~local_bc.val & enc->status_flag);
        in_stack_ffffffffffffff08 =
             (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),local_bc.val);
        _mpp_log_l(4,"mpp_enc","%p %08x -> %08x [%08x] notify %08x -> %s\n","check_enc_async_wait",
                   enc,(ulong)enc->status_flag,in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,
                   uVar30,pcVar26);
      }
      enc->status_flag = (RK_U32)EVar38;
      enc->notify_flag = RVar16;
      if (bVar7) {
        enc->work_count = enc->work_count + 1;
      }
      else {
        enc->wait_count = enc->wait_count + 1;
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","wait start\n","mpp_enc_async_thread");
        }
        MVar13 = this->mStatus[0];
        this->mStatus[0] = MPP_THREAD_WAITING;
        pthread_cond_wait(local_40,local_78);
        if (this->mStatus[0] == MPP_THREAD_WAITING) {
          this->mStatus[0] = MVar13;
        }
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","wait done\n","mpp_enc_async_thread");
        }
      }
      pthread_mutex_unlock(local_78);
      if ((enc->cmd_send == enc->cmd_recv) && (enc->reset_flag == 0)) {
        pvVar20 = enc->mpp;
        pEVar17 = enc->async;
        local_b8 = (MppPacket)0x0;
        local_98 = (MppFrame)0x0;
        __s = pEVar17;
        if (enc->hnd == (HalTaskHnd)0x0) {
          hal_task_get_hnd(enc->tasks,0,local_70);
          if (enc->hnd != (HalTaskHnd)0x0) {
            EVar38.val = EVar38.val & 0xffef;
            uVar37 = (ushort)EVar38.val;
            local_bc.val._0_2_ = uVar37;
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","get hnd success\n","try_get_async_task");
            }
            if (enc->async != (EncAsyncTaskInfo *)0x0) {
              in_stack_ffffffffffffff08 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xb6c);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "enc->async == __null","try_get_async_task",in_stack_ffffffffffffff08);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
            }
            __s = (EncAsyncTaskInfo *)hal_task_hnd_get_data(enc->hnd);
            memset(__s,0,0x238);
            (__s->task).rc_task = &__s->rc;
            (__s->task).frm_cfg = &__s->usr;
            enc->async = __s;
            if (enc->hnd == (HalTaskHnd)0x0) {
              in_stack_ffffffffffffff08 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xb77);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->hnd",
                         "try_get_async_task",in_stack_ffffffffffffff08);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
              pEVar17 = enc->async;
              goto LAB_0014151c;
            }
            goto LAB_00141663;
          }
          local_bc.val = CONCAT22(local_bc.val._2_2_,(short)EVar38.val) | 0x10;
          uVar35 = 0xffffffff;
          this = local_a0;
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","get hnd failed\n","try_get_async_task");
            this = local_a0;
          }
        }
        else {
LAB_0014151c:
          uVar37 = (ushort)EVar38.val;
          if (pEVar17 == (EncAsyncTaskInfo *)0x0) {
            in_stack_ffffffffffffff08 =
                 (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xb78);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->async",
                       "try_get_async_task",in_stack_ffffffffffffff08);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
          }
LAB_00141663:
          local_b8 = (__s->task).packet;
          local_98 = (__s->task).frame;
          this = local_a0;
          if (local_98 == (MppFrame)0x0) {
            ppVar18 = *(pthread_mutex_t **)((long)pvVar20 + 0x10);
            if (ppVar18 != (pthread_mutex_t *)0x0) {
              pthread_mutex_lock(ppVar18);
              RVar15 = mpp_list::list_size((mpp_list *)&ppVar18->__data);
              this = local_a0;
              if (RVar15 != 0) {
                mpp_list::del_at_head((mpp_list *)&ppVar18->__data,&local_98,8);
                pthread_cond_signal((pthread_cond_t *)(ppVar18 + 1));
                piVar1 = (int *)((long)pvVar20 + 0x2c);
                *piVar1 = *piVar1 + 1;
                if (local_98 == (MppFrame)0x0) {
                  in_stack_ffffffffffffff08 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xb8a);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"frame",
                             "try_get_async_task",in_stack_ffffffffffffff08);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                }
                this = local_a0;
                *(byte *)&__s->status = *(byte *)&__s->status | 2;
                local_bc.val = CONCAT22(local_bc.val._2_2_,uVar37) & 0xfffffffe;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","get input frame success\n","try_get_async_task");
                }
                pvVar22 = mpp_frame_get_stopwatch(local_98);
                mpp_stopwatch_record(pvVar22,"encode task start");
                (__s->task).frame = local_98;
                uVar37 = uVar37 & 0xfffe;
              }
              pthread_mutex_unlock(ppVar18);
              if (local_98 != (MppFrame)0x0) goto LAB_00141685;
            }
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","get input frame failed\n","try_get_async_task");
            }
            local_bc.val = CONCAT22(local_bc.val._2_2_,uVar37) | 1;
            uVar35 = 0xffffffff;
          }
          else {
LAB_00141685:
            if (local_b8 == (MppPacket)0x0) {
              RVar15 = mpp_frame_has_meta(local_98);
              if (RVar15 != 0) {
                pvVar23 = mpp_frame_get_meta(local_98);
                mpp_meta_get_packet(pvVar23,KEY_OUTPUT_PACKET,&local_b8);
              }
              if (local_b8 != (MppPacket)0x0) {
                *(byte *)&__s->status = *(byte *)&__s->status | 4;
                local_bc.val = CONCAT22(local_bc.val._2_2_,uVar37) & 0xfffffff7;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","get output packet success\n","try_get_async_task");
                }
                (__s->task).packet = local_b8;
              }
            }
            if (local_98 == (MppFrame)0x0) {
              in_stack_ffffffffffffff08 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xbb0);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"frame",
                         "try_get_async_task",in_stack_ffffffffffffff08);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
            }
            ppVar18 = (pthread_mutex_t *)mpp_frame_get_stopwatch(local_98);
            uVar30 = (__s->status).val;
            if ((uVar30 & 8) == 0) {
              RVar16 = enc->task_idx;
              enc->task_idx = RVar16 + 1;
              __s->seq_idx = RVar16;
              RVar24 = mpp_frame_get_pts((__s->task).frame);
              __s->pts = RVar24;
              (__s->task).stopwatch = ppVar18;
              s = (__s->task).frame;
              (__s->rc).frame = s;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task seq idx %d start\n","try_get_async_task",0);
                s = (__s->task).frame;
              }
              local_d0 = (MppPskipMode)(__s->task).packet;
              (__s->task).input = (MppBuffer)0x0;
              (__s->task).output = (MppBuffer)0x0;
              if (local_d0 == (MppPskipMode)0x0) {
                mpp_packet_new((MppPacket *)&local_d0);
                (__s->task).packet = (MppPacket)local_d0;
              }
              else {
                pvVar19 = mpp_packet_get_buffer((MppPacket)local_d0);
                (__s->task).output = pvVar19;
              }
              if (s != (MppFrame)0x0) {
                local_c8 = ppVar18;
                RVar24 = mpp_frame_get_pts(s);
                pvVar19 = mpp_frame_get_buffer(s);
                (__s->task).input = pvVar19;
                mpp_packet_set_pts((MppPacket)local_d0,RVar24);
                MVar34 = local_d0;
                RVar24 = mpp_frame_get_dts(s);
                mpp_packet_set_dts((MppPacket)MVar34,RVar24);
                RVar16 = mpp_frame_get_eos(s);
                if (RVar16 == 0) {
                  mpp_packet_clr_eos((MppPacket)local_d0);
                }
                else {
                  mpp_packet_set_eos((MppPacket)local_d0);
                }
                ppVar18 = local_c8;
                if ((__s->task).input != (MppBuffer)0x0) {
                  uVar30 = (__s->status).val | 8;
                  (__s->status).val = uVar30;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task frame packet ready\n","try_get_async_task");
                    uVar30 = (__s->status).val;
                  }
                  goto LAB_00141a66;
                }
              }
              mpp_stopwatch_record(ppVar18,"empty frame on check frm pkt");
              (__s->task).valid = 1;
              (__s->task).length = 0;
              (__s->task).flags.drop_by_fps = 1;
LAB_00141ae4:
              uVar35 = 0;
            }
            else {
LAB_00141a66:
              local_a8 = &__s->rc;
              local_c8 = (pthread_mutex_t *)CONCAT44(local_c8._4_4_,__s->seq_idx);
              if ((uVar30 & 0x20) == 0) {
                MVar14 = rc_frm_check_drop(enc->rc_ctx,local_a8);
                if (MVar14 == MPP_OK) {
                  *(byte *)&__s->status = *(byte *)&__s->status | 0x20;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d drop %d\n","try_get_async_task",
                               (ulong)local_c8 & 0xffffffff,
                               (ulong)(*(uint *)((long)&(__s->rc).frm + 4) & 1));
                  }
                  (__s->task).valid = 1;
                  if (((__s->rc).frm.val & 0x100000000) != 0) {
                    mpp_stopwatch_record(ppVar18,"invalid on frame rate drop");
                    (__s->task).length = 0;
                    (__s->task).flags.drop_by_fps = 1;
                    goto LAB_00141ae4;
                  }
                  pMVar5 = (__s->task).frm_cfg;
                  RVar16 = local_60->force_flag;
                  RVar15 = local_60->force_idr;
                  RVar8 = local_60->force_pskip;
                  RVar9 = local_60->force_nonref;
                  RVar10 = local_60->force_temporal_id;
                  MVar11 = local_60->force_ref_mode;
                  RVar12 = local_60->force_ref_arg;
                  pMVar5->force_lt_idx = local_60->force_lt_idx;
                  pMVar5->force_temporal_id = RVar10;
                  pMVar5->force_ref_mode = MVar11;
                  pMVar5->force_ref_arg = RVar12;
                  pMVar5->force_flag = RVar16;
                  pMVar5->force_idr = RVar15;
                  pMVar5->force_pskip = RVar8;
                  pMVar5->force_nonref = RVar9;
                  local_60->force_flag = 0;
                  goto LAB_00141b69;
                }
                pvVar20 = enc->mpp;
                in_stack_ffffffffffffff08 =
                     (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),MVar14);
                pcVar26 = "mpp %p rc_frm_check_drop:%-4d failed return %d";
                uVar33 = 0xbd4;
LAB_00142048:
                uVar35 = (ulong)(uint)MVar14;
                _mpp_log_l(2,"mpp_enc",pcVar26,(char *)0x0,pvVar20,uVar33,in_stack_ffffffffffffff08)
                ;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d terminate\n","try_get_async_task",
                             (ulong)local_c8 & 0xffffffff);
                }
                pvVar20 = enc->mpp;
                mpp_stopwatch_record((__s->task).stopwatch,"encode task done");
                MVar34 = (MppPskipMode)(__s->task).packet;
                if (MVar34 != (MppPskipMode)0x0) {
                  local_d0 = MVar34;
                  mpp_packet_set_length((MppPacket)MVar34,(ulong)(__s->task).length);
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld\n",
                               "async_task_terminate",(ulong)*(ushort *)((long)&(__s->rc).frm + 6),
                               enc->task_pts);
                  }
                  local_c8 = *(pthread_mutex_t **)((long)pvVar20 + 8);
                  if (local_c8 != (pthread_mutex_t *)0x0) {
                    if (enc->frame != (MppFrame)0x0) {
                      pvVar23 = mpp_packet_get_meta((MppPacket)MVar34);
                      pvVar22 = mpp_frame_get_stopwatch(enc->frame);
                      mpp_stopwatch_record(pvVar22,"encode task terminate");
                      mpp_meta_set_frame(pvVar23,KEY_INPUT_FRAME,enc->frame);
                      enc->frame = (MppFrame)0x0;
                    }
                    ppVar18 = local_c8;
                    pthread_mutex_lock(local_c8);
                    mpp_list::add_at_tail((mpp_list *)&ppVar18->__data,&local_d0,8);
                    piVar1 = (int *)((long)pvVar20 + 0x20);
                    *piVar1 = *piVar1 + 1;
                    pthread_cond_signal((pthread_cond_t *)(ppVar18 + 1));
                    if (local_d0 == (MppPskipMode)0x0) {
                      in_stack_ffffffffffffff08 =
                           (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xace);
                      _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"pkt",
                                 "async_task_terminate",in_stack_ffffffffffffff08);
                      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                    }
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","packet out ready\n","async_task_terminate");
                    }
                    pthread_mutex_unlock(ppVar18);
                  }
                }
                memset(__s,0,0x238);
                (__s->task).rc_task = local_a8;
                (__s->task).frm_cfg = &__s->usr;
                this = local_a0;
              }
              else {
LAB_00141b69:
                pHVar29 = &__s->task;
                if (pHVar29->valid == 0) {
                  in_stack_ffffffffffffff08 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xbe7);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "hal_task->valid","try_get_async_task",in_stack_ffffffffffffff08);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                }
                if (((uint)__s->status & 0x80) == 0) {
                  MVar34 = (MppPskipMode)(__s->task).output;
                  local_88 = pHVar29;
                  if (MVar34 == (MppPskipMode)0x0) {
                    uVar25 = ((enc->cfg).prep.height + 0xfU & 0xffffff0) *
                             ((enc->cfg).prep.width + 0xfU & 0xfffffff0);
                    uVar30 = uVar25 * 3 >> 1;
                    if (enc->coding != MPP_VIDEO_CodingMJPEG) {
                      uVar30 = uVar25;
                    }
                    pvVar20 = enc->mpp;
                    pvVar31 = (__s->task).packet;
                    local_d0.pskip_is_ref = 0;
                    local_d0.pskip_is_non_ref = 0;
                    if (uVar30 == 0) {
                      in_stack_ffffffffffffff08 =
                           (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xb41);
                      _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"size",
                                 "check_async_pkt_buf",in_stack_ffffffffffffff08);
                      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                    }
                    mpp_buffer_get_with_tag
                              (*(MppBufferGroup *)((long)pvVar20 + 0x38),(MppBuffer *)&local_d0,
                               (ulong)uVar30,"mpp_enc","check_async_pkt_buf");
                    mpp_buffer_attach_dev_f("check_async_pkt_buf",(MppBuffer)local_d0,enc->dev);
                    this = local_a0;
                    if (local_d0 == (MppPskipMode)0x0) {
                      in_stack_ffffffffffffff08 =
                           (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xb44);
                      _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"buffer",
                                 "check_async_pkt_buf",in_stack_ffffffffffffff08);
                      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                    }
                    enc->pkt_buf = (MppBuffer)local_d0;
                    pvVar20 = mpp_buffer_get_ptr_with_caller
                                        ((MppBuffer)local_d0,"check_async_pkt_buf");
                    *(void **)((long)pvVar31 + 8) = pvVar20;
                    *(void **)((long)pvVar31 + 0x10) = pvVar20;
                    sVar21 = mpp_buffer_get_size_with_caller
                                       ((MppBuffer)local_d0,"check_async_pkt_buf");
                    *(size_t *)((long)pvVar31 + 0x18) = sVar21;
                    *(undefined8 *)((long)pvVar31 + 0x20) = 0;
                    *(MppPskipMode *)((long)pvVar31 + 0x40) = local_d0;
                    (__s->task).output = (MppBuffer)local_d0;
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      pvVar31 = (__s->task).packet;
                      pcVar26 = "create output pkt %p buf %p\n";
                      MVar34 = local_d0;
                      goto LAB_00141e06;
                    }
                  }
                  else if (((byte)mpp_enc_debug & 0x20) != 0) {
                    pvVar31 = (__s->task).packet;
                    local_90 = mpp_packet_get_pos(pvVar31);
                    in_stack_ffffffffffffff10 = mpp_packet_get_length((__s->task).packet);
                    pcVar26 = "output to pkt %p buf %p pos %p length %d\n";
                    in_stack_ffffffffffffff08 = local_90;
LAB_00141e06:
                    _mpp_log_l(4,"mpp_enc",pcVar26,"check_async_pkt_buf",pvVar31,MVar34);
                  }
                  pHVar29 = local_88;
                  *(byte *)&__s->status = *(byte *)&__s->status | 0x80;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d check pkt buffer success\n","try_get_async_task"
                               ,(ulong)local_c8 & 0xffffffff);
                  }
                }
                if ((__s->task).packet == (MppPacket)0x0) {
                  in_stack_ffffffffffffff08 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xbf0);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "hal_task->packet","try_get_async_task",in_stack_ffffffffffffff08);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                }
                if ((__s->task).output == (MppBuffer)0x0) {
                  in_stack_ffffffffffffff08 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xbf1);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "hal_task->output","try_get_async_task",in_stack_ffffffffffffff08);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                }
                if (enc->hal_info_updated == 0) {
                  update_enc_hal_info(enc);
                  enc->hal_info_updated = 1;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d update enc hal info success\n",
                               "try_get_async_task",(ulong)local_c8 & 0xffffffff);
                  }
                }
                if (((uint)enc->hdr_status & 1) == 0) {
                  enc_impl_gen_hdr(enc->impl,enc->hdr_pkt);
                  sVar21 = mpp_packet_get_length(enc->hdr_pkt);
                  enc->hdr_len = (RK_U32)sVar21;
                  *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 1;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d update header length %d\n","try_get_async_task",
                               (ulong)local_c8 & 0xffffffff,sVar21 & 0xffffffff);
                  }
                  mpp_packet_append((__s->task).packet,enc->hdr_pkt);
                  RVar16 = enc->hdr_len;
                  (__s->task).header_length = RVar16;
                  pRVar3 = &(__s->task).length;
                  *pRVar3 = *pRVar3 + RVar16;
                  *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 8;
                }
                check_hal_task_pkt_len
                          ((HalEncTask *)(__s->task).packet,(char *)(ulong)(__s->task).length);
                uVar30 = (__s->status).val;
                if ((uVar30 >> 8 & 1) == 0) {
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d enc start\n","try_get_async_task",
                               (ulong)local_c8 & 0xffffffff);
                  }
                  MVar14 = enc_impl_start(enc->impl,pHVar29);
                  if (MVar14 != MPP_OK) {
                    pvVar20 = enc->mpp;
                    in_stack_ffffffffffffff08 =
                         (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),MVar14);
                    pcVar26 = "mpp %p enc_impl_start:%-4d failed return %d";
                    uVar33 = 0xc10;
                    goto LAB_00142048;
                  }
                  uVar30 = (__s->status).val | 0x100;
                  (__s->status).val = uVar30;
                }
                if ((uVar30 >> 9 & 1) == 0) {
                  if ((__s->usr).force_flag != 0) {
                    mpp_enc_refs_set_usr_cfg(enc->refs,&__s->usr);
                    (__s->usr).force_flag = 0;
                  }
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d refs force update success\n",
                               "try_get_async_task",(ulong)local_c8 & 0xffffffff);
                  }
                  uVar30 = (__s->status).val | 0x200;
                  (__s->status).val = uVar30;
                }
                uVar35 = 0;
                if ((uVar30 >> 0xb & 1) == 0) {
                  mpp_enc_refs_stash(enc->refs);
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d refs stash success\n","try_get_async_task",
                               (ulong)local_c8 & 0xffffffff);
                  }
                  pbVar4 = (byte *)((long)&__s->status + 1);
                  *pbVar4 = *pbVar4 | 8;
                }
              }
            }
          }
        }
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","try_get_async_task ret %d\n","mpp_enc_async_thread",uVar35);
        }
        if ((int)uVar35 == 0) {
          pEVar17 = enc->async;
          if (pEVar17 == (EncAsyncTaskInfo *)0x0) {
            in_stack_ffffffffffffff08 =
                 (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xd6f);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->async",
                       "mpp_enc_async_thread",in_stack_ffffffffffffff08);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
            pEVar17 = enc->async;
          }
          if ((pEVar17->task).valid == 0) {
            in_stack_ffffffffffffff08 =
                 (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xd70);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "enc->async->task.valid","mpp_enc_async_thread",in_stack_ffffffffffffff08);
            if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00142d75:
              abort();
            }
            pEVar17 = enc->async;
            ppVar18 = (pthread_mutex_t *)(pEVar17->task).rc_task;
            pEVar39 = (EncFrmStatus *)((long)ppVar18 + 0x98);
            pMVar32 = (Mpp *)enc->mpp;
            pEVar27 = (EncRcTask *)&pEVar17->task;
            pvVar28 = enc->enc_hal;
            pHVar29 = (HalEncTask *)enc->impl;
            pMVar36 = (Mpp *)&pEVar17->status;
            RVar15 = pEVar17->seq_idx;
            if ((pEVar17->task).valid == 0) {
              in_stack_ffffffffffffff08 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xc54);
              local_90 = (void *)CONCAT44(local_90._4_4_,pEVar17->seq_idx);
              local_c8 = ppVar18;
              local_b0 = (Mpp *)&pEVar17->status;
              local_a8 = (EncRcTask *)&pEVar17->task;
              local_88 = (HalEncTask *)enc->impl;
              local_80 = enc->enc_hal;
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"hal_task->valid",
                         "proc_async_task",in_stack_ffffffffffffff08);
              ppVar18 = local_c8;
              pEVar27 = local_a8;
              pvVar28 = local_80;
              pHVar29 = local_88;
              pMVar36 = local_b0;
              RVar15 = (RK_S32)local_90;
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
            }
          }
          else {
            pMVar32 = (Mpp *)enc->mpp;
            ppVar18 = (pthread_mutex_t *)(pEVar17->task).rc_task;
            pEVar39 = (EncFrmStatus *)((long)ppVar18 + 0x98);
            pEVar27 = (EncRcTask *)&pEVar17->task;
            pvVar28 = enc->enc_hal;
            pHVar29 = (HalEncTask *)enc->impl;
            pMVar36 = (Mpp *)&pEVar17->status;
            RVar15 = pEVar17->seq_idx;
          }
          if ((pEVar17->task).flags.drop_by_fps == 0) {
            local_90 = (void *)CONCAT44(local_90._4_4_,RVar15);
            local_c8 = ppVar18;
            local_b0 = pMVar32;
            local_a8 = pEVar27;
            local_88 = pHVar29;
            local_80 = pvVar28;
            if ((((EncAsyncStatus *)&pMVar36->mPktIn)->val & 0x40) == 0) {
              ((EncAsyncStatus *)&pMVar36->mPktIn)->val =
                   ((EncAsyncStatus *)&pMVar36->mPktIn)->val | 0x40;
              mpp_enc_get_pskip_mode(*(Mpp **)((long)enc->mpp + 0xb0),pEVar17,&local_d0);
              if (local_d0.pskip_is_non_ref != 0 || local_d0.pskip_is_ref != 0) {
                MVar14 = mpp_enc_force_pskip((Mpp *)enc->mpp,pEVar17);
                if (MVar14 == MPP_OK) goto LAB_001424dd;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d set force pskip failed.","proc_async_task",
                             (ulong)*(ushort *)((long)pEVar39 + 6));
                }
              }
            }
            if (((enc->support_hw_deflicker != 0) && ((enc->cfg).rc.debreath_en != 0)) &&
               (RVar15 = mpp_enc_refs_next_frm_is_intra(enc->refs), RVar15 != 0)) {
              do {
                MVar14 = try_proc_processing_task(enc,&local_bc);
              } while (MVar14 == MPP_OK);
              MVar14 = mpp_enc_proc_two_pass(local_b0,pEVar17);
              if (MVar14 != MPP_OK) goto LAB_00142cf3;
            }
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","proc_async_task",
                         (ulong)local_90 & 0xffffffff);
            }
            mpp_enc_refs_get_cpb(enc->refs,(EncCpbStatus *)&local_c8->__data);
            if ((mpp_enc_debug._2_1_ & 1) != 0) {
              _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                         "proc_async_task",(ulong)local_90 & 0xffffffff);
            }
            MVar14 = enc_impl_proc_dpb(local_88,(HalEncTask *)local_a8);
            if (MVar14 == MPP_OK) {
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d rc frame start\n","proc_async_task",
                           (ulong)*(ushort *)((long)pEVar39 + 6));
              }
              MVar14 = rc_frm_start(enc->rc_ctx,(EncRcTask *)&local_c8->__data);
              if (MVar14 == MPP_OK) {
                mpp_enc_add_sw_header(enc,(HalEncTask *)local_a8);
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","proc_async_task",
                             (ulong)*(ushort *)((long)pEVar39 + 6));
                }
                MVar14 = enc_impl_proc_hal(local_88,(HalEncTask *)local_a8);
                if (MVar14 == MPP_OK) {
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d hal get task\n","proc_async_task",
                               (ulong)*(ushort *)((long)pEVar39 + 6));
                  }
                  MVar14 = mpp_enc_hal_get_task(local_80,(HalEncTask *)local_a8);
                  if (MVar14 == MPP_OK) {
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","proc_async_task",
                                 (ulong)*(ushort *)((long)pEVar39 + 6));
                    }
                    MVar14 = rc_hal_start(enc->rc_ctx,(EncRcTask *)&local_c8->__data);
                    if (MVar14 == MPP_OK) {
                      if (((byte)mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","proc_async_task",
                                   (ulong)*(ushort *)((long)pEVar39 + 6));
                      }
                      MVar14 = mpp_enc_hal_gen_regs(local_80,(HalEncTask *)local_a8);
                      if (MVar14 == MPP_OK) {
                        mpp_stopwatch_record((pEVar17->task).stopwatch,"encode hal start");
                        if (((byte)mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal start\n","proc_async_task",
                                     (ulong)*(ushort *)((long)pEVar39 + 6));
                        }
                        MVar14 = mpp_enc_hal_start(local_80,(HalEncTask *)local_a8);
                        if (MVar14 == MPP_OK) goto LAB_001424dd;
                        in_stack_ffffffffffffff08 =
                             (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),MVar14
                                             );
                        pcVar26 = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
                        uVar33 = 0xc8e;
                      }
                      else {
                        in_stack_ffffffffffffff08 =
                             (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),MVar14
                                             );
                        pcVar26 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                        uVar33 = 0xc8a;
                      }
                    }
                    else {
                      in_stack_ffffffffffffff08 =
                           (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),MVar14);
                      pcVar26 = "mpp %p rc_hal_start:%-4d failed return %d";
                      uVar33 = 0xc87;
                    }
                  }
                  else {
                    in_stack_ffffffffffffff08 =
                         (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),MVar14);
                    pcVar26 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                    uVar33 = 0xc84;
                  }
                }
                else {
                  in_stack_ffffffffffffff08 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),MVar14);
                  pcVar26 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                  uVar33 = 0xc81;
                }
              }
              else {
                in_stack_ffffffffffffff08 =
                     (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),MVar14);
                pcVar26 = "mpp %p rc_frm_start:%-4d failed return %d";
                uVar33 = 0xc7b;
              }
            }
            else {
              in_stack_ffffffffffffff08 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),MVar14);
              pcVar26 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
              uVar33 = 0xc78;
            }
            _mpp_log_l(2,"mpp_enc",pcVar26,(char *)0x0,local_b0,uVar33,in_stack_ffffffffffffff08);
          }
          else {
LAB_001424dd:
            pbVar4 = (byte *)((long)&pMVar36->mPktIn + 3);
            *pbVar4 = *pbVar4 & 0xf7;
            hal_task_hnd_set_status(*local_70,1);
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d on processing ret %d\n","proc_async_task",
                         (ulong)*(ushort *)((long)pEVar39 + 6),0);
            }
            *local_70 = (HalTaskHnd)0x0;
            local_70[1] = (EncAsyncTaskInfo *)0x0;
          }
          (enc->hdr_status).val = *(byte *)&enc->hdr_status & 1;
        }
        else {
          try_proc_processing_task(enc,&local_bc);
        }
      }
      else {
        ppVar18 = *(pthread_mutex_t **)((long)local_38 + 0x10);
        pthread_mutex_lock(ppVar18);
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","ctrl proc %d cmd %08x\n","mpp_enc_async_thread",
                     (ulong)enc->cmd_recv,(ulong)enc->cmd);
        }
        do {
          MVar14 = try_proc_processing_task(enc,&local_bc);
        } while (MVar14 == MPP_OK);
        if (enc->cmd_send == enc->cmd_recv) {
          if (enc->reset_flag != 0) {
            if (((byte)mpp_enc_debug & 0x20) == 0) goto LAB_001429b9;
            fmt = "thread reset start\n";
            pcVar26 = "mpp_enc_async_thread";
            do {
              _mpp_log_l(4,"mpp_enc",fmt,pcVar26);
LAB_001429b9:
              do {
                RVar15 = mpp_list::list_size((mpp_list *)&ppVar18->__data);
                ppVar6 = local_78;
                if (RVar15 == 0) {
                  pthread_mutex_lock(local_78);
                  enc->status_flag = 0;
                  pthread_mutex_unlock(ppVar6);
                  *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
                  pRVar2 = &(enc->frm_cfg).force_idr;
                  *pRVar2 = *pRVar2 + 1;
                  pthread_mutex_lock(local_68);
                  enc->reset_flag = 0;
                  sem_post(local_58);
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","thread reset done\n","mpp_enc_async_thread");
                  }
                  pthread_mutex_unlock(local_68);
                  this = local_a0;
                  goto LAB_00142ce3;
                }
                pvVar20 = enc->mpp;
                local_d0.pskip_is_ref = 0;
                local_d0.pskip_is_non_ref = 0;
                local_b8 = (MppPacket)0x0;
                mpp_list::del_at_head(*(mpp_list **)((long)pvVar20 + 0x10),&local_d0,8);
                *(int *)((long)pvVar20 + 0x2c) = *(int *)((long)pvVar20 + 0x2c) + 1;
                if (local_d0 == (MppPskipMode)0x0) {
                  in_stack_ffffffffffffff08 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xae2);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"frm",
                             "async_task_skip",in_stack_ffffffffffffff08);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                }
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","skip input frame start\n","async_task_skip");
                }
                pvVar22 = mpp_frame_get_stopwatch((MppFrame)local_d0);
                mpp_stopwatch_record(pvVar22,"skip task start");
                RVar15 = mpp_frame_has_meta((MppFrame)local_d0);
                if ((RVar15 != 0) &&
                   (pvVar23 = mpp_frame_get_meta((MppFrame)local_d0), pvVar23 != (MppMeta)0x0)) {
                  mpp_meta_get_packet(pvVar23,KEY_OUTPUT_PACKET,&local_b8);
                }
                if ((local_b8 == (MppPacket)0x0) &&
                   (mpp_packet_new(&local_b8), local_b8 == (MppPacket)0x0)) {
                  in_stack_ffffffffffffff08 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xaf2);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"pkt",
                             "async_task_skip",in_stack_ffffffffffffff08);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                }
                mpp_packet_set_length(local_b8,0);
                pvVar31 = local_b8;
                RVar24 = mpp_frame_get_pts((MppFrame)local_d0);
                mpp_packet_set_pts(pvVar31,RVar24);
                pvVar31 = local_b8;
                RVar24 = mpp_frame_get_dts((MppFrame)local_d0);
                mpp_packet_set_dts(pvVar31,RVar24);
                RVar16 = mpp_frame_get_eos((MppFrame)local_d0);
                if (RVar16 == 0) {
                  mpp_packet_clr_eos(local_b8);
                }
                else {
                  mpp_packet_set_eos(local_b8);
                }
                pvVar23 = mpp_packet_get_meta(local_b8);
                if (pvVar23 == (MppMeta)0x0) {
                  in_stack_ffffffffffffff08 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),0xafe);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"meta",
                             "async_task_skip",in_stack_ffffffffffffff08);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00142d75;
                }
                mpp_meta_set_frame(pvVar23,KEY_INPUT_FRAME,(MppFrame)local_d0);
                ppVar6 = *(pthread_mutex_t **)((long)pvVar20 + 8);
                if (ppVar6 != (pthread_mutex_t *)0x0) {
                  pthread_mutex_lock(ppVar6);
                  mpp_stopwatch_record(pvVar22,"skip task output");
                  mpp_list::add_at_tail((mpp_list *)&ppVar6->__data,&local_b8,8);
                  *(int *)((long)pvVar20 + 0x20) = *(int *)((long)pvVar20 + 0x20) + 1;
                  pthread_cond_signal((pthread_cond_t *)(ppVar6 + 1));
                  pthread_mutex_unlock(ppVar6);
                }
              } while (((byte)mpp_enc_debug & 0x20) == 0);
              fmt = "packet skip ready\n";
              pcVar26 = "async_task_skip";
            } while( true );
          }
        }
        else {
          sem_wait(local_48);
          MVar14 = mpp_enc_proc_cfg(enc,enc->cmd,enc->param);
          if (MVar14 != MPP_OK) {
            *enc->cmd_ret = MVar14;
          }
          uVar30 = enc->cmd_recv + 1;
          enc->cmd_recv = uVar30;
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","ctrl proc %d done send %d\n","mpp_enc_async_thread",
                       (ulong)uVar30,(ulong)enc->cmd_send);
          }
          enc->param = (void *)0x0;
          enc->cmd = 0;
          sem_post(local_50);
          mpp_enc_hal_prepare(enc->enc_hal);
          mpp_enc_proc_rc_update(enc);
        }
LAB_00142ce3:
        pthread_mutex_unlock(ppVar18);
        local_bc.val = 0;
      }
LAB_00142cf3:
      pthread_mutex_lock(local_78);
      MVar13 = MppThread::get_status(this,THREAD_WORK);
    } while (MVar13 == MPP_THREAD_RUNNING);
  }
  pthread_mutex_unlock(local_78);
  do {
    MVar14 = try_proc_processing_task(enc,&local_bc);
  } while (MVar14 == MPP_OK);
  if (((byte)mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","thread finish\n","mpp_enc_async_thread");
  }
  return (void *)0x0;
}

Assistant:

void *mpp_enc_async_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MppThread *thd_enc = enc->thread_enc;
    EncAsyncWait wait;
    MPP_RET ret = MPP_OK;

    enc_dbg_func("thread start\n");

    wait.val = 0;

    while (1) {
        {
            AutoMutex autolock(thd_enc->mutex());
            if (MPP_THREAD_RUNNING != thd_enc->get_status())
                break;

            if (check_enc_async_wait(enc, &wait)) {
                enc_dbg_detail("wait start\n");
                thd_enc->wait();
                enc_dbg_detail("wait done\n");
            }
        }

        // When encoder is not on encoding process external config and reset
        // 1. process user control and reset flag
        if (enc->cmd_send != enc->cmd_recv || enc->reset_flag) {
            mpp_list *frm_in = mpp->mFrmIn;

            /* when process cmd or reset hold frame input */
            frm_in->lock();

            enc_dbg_detail("ctrl proc %d cmd %08x\n", enc->cmd_recv, enc->cmd);

            // wait all tasks done
            while (MPP_OK == try_proc_processing_task(enc, &wait));

            if (enc->cmd_send != enc->cmd_recv) {
                sem_wait(&enc->cmd_start);
                ret = mpp_enc_proc_cfg(enc, enc->cmd, enc->param);
                if (ret)
                    *enc->cmd_ret = ret;
                enc->cmd_recv++;
                enc_dbg_detail("ctrl proc %d done send %d\n", enc->cmd_recv,
                               enc->cmd_send);
                mpp_assert(enc->cmd_send == enc->cmd_send);
                enc->param = NULL;
                enc->cmd = (MpiCmd)0;
                sem_post(&enc->cmd_done);

                // async cfg update process for hal
                // mainly for buffer prepare
                mpp_enc_hal_prepare(enc->enc_hal);

                /* NOTE: here will clear change flag of rc and prep cfg */
                mpp_enc_proc_rc_update(enc);
                goto SYNC_DONE;
            }

            if (enc->reset_flag) {
                enc_dbg_detail("thread reset start\n");

                /* skip the frames in input queue */
                while (frm_in->list_size())
                    async_task_skip(enc);

                {
                    AutoMutex autolock(thd_enc->mutex());
                    enc->status_flag = 0;
                }

                enc->frm_cfg.force_flag |= ENC_FORCE_IDR;
                enc->frm_cfg.force_idr++;

                AutoMutex autolock(thd_enc->mutex(THREAD_CONTROL));
                enc->reset_flag = 0;
                sem_post(&enc->enc_reset);
                enc_dbg_detail("thread reset done\n");
            }
        SYNC_DONE:
            frm_in->unlock();
            wait.val = 0;
            continue;
        }

        // 2. try get a task to encode
        ret = try_get_async_task(enc, &wait);
        enc_dbg_detail("try_get_async_task ret %d\n", ret);
        if (ret) {
            try_proc_processing_task(enc, &wait);
            continue;
        }

        mpp_assert(enc->async);
        mpp_assert(enc->async->task.valid);

        proc_async_task(enc, &wait);
    }
    /* wait all task done */
    while (MPP_OK == try_proc_processing_task(enc, &wait));

    enc_dbg_func("thread finish\n");

    return NULL;
}